

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::Decode(GridAxisIrregular *this,KDataStream *stream)

{
  ushort uVar1;
  pointer puVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  KUINT16 KVar3;
  KException *this_01;
  byte bVar4;
  KUINT16 i;
  ushort uVar5;
  allocator<char> local_59;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_58;
  KUINT16 ui16TmpVal;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  if (0x27 < KVar3) {
    puVar2 = (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar2) {
      (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    puVar2 = (this->m_vui16Padding).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar2) {
      (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    local_58 = &this->m_vui16Padding;
    GridAxisRegular::Decode(&this->super_GridAxisRegular,stream);
    KDataStream::Read<double>(stream,(double *)&this->m_f64CoordScaleXi);
    KDataStream::Read<double>(stream,(double *)&this->m_f64CoordOffsetXi);
    ui16TmpVal = 0;
    for (uVar5 = 0; this_00 = local_58, uVar1 = (this->super_GridAxisRegular).m_ui16NumPoints,
        uVar5 < uVar1; uVar5 = uVar5 + 1) {
      KDataStream::Read<unsigned_short>(stream,&ui16TmpVal);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&this->m_vXiValues,&ui16TmpVal);
    }
    for (bVar4 = 0; bVar4 < ((byte)uVar1 & 3); bVar4 = bVar4 + 1) {
      KDataStream::Read<unsigned_short>(stream,&ui16TmpVal);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(this_00,&ui16TmpVal);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ui16TmpVal,"Decode",&local_59);
  KException::KException(this_01,(KString *)&ui16TmpVal,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void GridAxisIrregular::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_AXIS_IRREGULAR )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vXiValues.clear();
    m_vui16Padding.clear();

    GridAxisRegular::Decode( stream );

    stream >> m_f64CoordScaleXi
           >> m_f64CoordOffsetXi;

    KUINT16 ui16TmpVal = 0;
    for( KUINT16 i = 0; i < m_ui16NumPoints; ++i )
    {
        stream >> ui16TmpVal;
        m_vXiValues.push_back( ui16TmpVal );
    }

    // Calculate the padding that needs to be extracted. 64 bit boundary
    KUINT8 NumPadding = m_ui16NumPoints % 4;
    for( KUINT8 i = 0; i < NumPadding; ++i )
    {
        stream >> ui16TmpVal;
        m_vui16Padding.push_back( ui16TmpVal );
    }
}